

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

bool __thiscall ElfFile::load(ElfFile *this,ByteArray *data,bool sort)

{
  pointer *pppEVar1;
  pointer *pppEVar2;
  ByteArray *this_00;
  ElfSection **ppEVar3;
  iterator __position;
  iterator iVar4;
  __normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_>
  __first;
  __normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_> __last
  ;
  ElfSection *pEVar5;
  Elf32_Shdr header;
  ElfSection **ppEVar6;
  bool bVar7;
  ElfSegment *pEVar8;
  ElfSection *pEVar9;
  pointer ppEVar10;
  uint uVar11;
  __normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_> _Var12
  ;
  ElfSection **ppEVar13;
  long lVar14;
  ElfSection **ppEVar15;
  uint uVar16;
  size_t __n;
  __normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_> __i;
  value_type __val;
  ulong uVar17;
  ByteArray segmentData;
  ElfSegment *segment;
  Elf32_Phdr sectionHeader;
  ByteArray local_a0;
  vector<ElfSection*,std::allocator<ElfSection*>> *local_88;
  ElfSegment *local_80;
  Elf32_Phdr local_78;
  Elf32_Shdr local_58;
  
  this_00 = &this->fileData;
  ByteArray::operator=(this_00,data);
  loadElfHeader(this);
  this->symTab = (ElfSection *)0x0;
  this->strTab = (ElfSection *)0x0;
  if ((this->fileHeader).e_phnum != 0) {
    uVar17 = 0;
    do {
      loadProgramHeader(this,&local_78,this_00,
                        (this->fileHeader).e_phentsize * uVar17 + (ulong)(this->fileHeader).e_phoff)
      ;
      ByteArray::mid(&local_a0,this_00,(ulong)local_78.p_offset,(ulong)local_78.p_filesz);
      pEVar8 = (ElfSegment *)operator_new(0x58);
      (pEVar8->header).p_filesz = local_78.p_filesz;
      (pEVar8->header).p_memsz = local_78.p_memsz;
      (pEVar8->header).p_flags = local_78.p_flags;
      (pEVar8->header).p_align = local_78.p_align;
      (pEVar8->header).p_type = local_78.p_type;
      (pEVar8->header).p_offset = local_78.p_offset;
      (pEVar8->header).p_vaddr = local_78.p_vaddr;
      (pEVar8->header).p_paddr = local_78.p_paddr;
      ByteArray::ByteArray(&pEVar8->data,&local_a0);
      (pEVar8->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pEVar8->paddrSection = (ElfSection *)0x0;
      (pEVar8->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pEVar8->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __position._M_current =
           (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_80 = pEVar8;
      if (__position._M_current ==
          (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ElfSegment*,std::allocator<ElfSegment*>>::_M_realloc_insert<ElfSegment*const&>
                  ((vector<ElfSegment*,std::allocator<ElfSegment*>> *)&this->segments,__position,
                   &local_80);
      }
      else {
        *__position._M_current = pEVar8;
        pppEVar1 = &(this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      ByteArray::~ByteArray(&local_a0);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (this->fileHeader).e_phnum);
  }
  if ((this->fileHeader).e_shnum != 0) {
    local_88 = (vector<ElfSection*,std::allocator<ElfSection*>> *)&this->segmentlessSections;
    uVar16 = 0;
    do {
      loadSectionHeader(this,&local_58,this_00,
                        (ulong)((this->fileHeader).e_shentsize * uVar16 + (this->fileHeader).e_shoff
                               ));
      pEVar9 = (ElfSection *)operator_new(0x68);
      header.sh_flags = local_58.sh_flags;
      header.sh_addr = local_58.sh_addr;
      header.sh_name = local_58.sh_name;
      header.sh_type = local_58.sh_type;
      header.sh_offset = local_58.sh_offset;
      header.sh_size = local_58.sh_size;
      header.sh_link = local_58.sh_link;
      header.sh_info = local_58.sh_info;
      header.sh_addralign = local_58.sh_addralign;
      header.sh_entsize = local_58.sh_entsize;
      ElfSection::ElfSection(pEVar9,header);
      iVar4._M_current =
           (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a0.data_ = (byte *)pEVar9;
      if (iVar4._M_current ==
          (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ElfSection*,std::allocator<ElfSection*>>::_M_realloc_insert<ElfSection*const&>
                  ((vector<ElfSection*,std::allocator<ElfSection*>> *)&this->sections,iVar4,
                   (ElfSection **)&local_a0);
      }
      else {
        *iVar4._M_current = pEVar9;
        pppEVar2 = &(this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
      ppEVar10 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->segments).
                                  super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10) >> 3))
      {
        lVar14 = 0;
        do {
          bVar7 = ElfSegment::isSectionPartOf(ppEVar10[lVar14],(ElfSection *)local_a0.data_);
          if (bVar7) {
            pEVar8 = (this->segments).
                     super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if (pEVar8 != (ElfSegment *)0x0) {
              ElfSegment::addSection(pEVar8,(ElfSection *)local_a0.data_);
              goto LAB_00176acb;
            }
            break;
          }
          lVar14 = lVar14 + 1;
          ppEVar10 = (this->segments).
                     super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (lVar14 < (int)((ulong)((long)(this->segments).
                                              super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppEVar10) >> 3));
      }
      uVar11 = ((Elf32_Shdr *)local_a0.data_)->sh_type;
      if ((uVar11 & 0xfffffff7) != 0) {
        ByteArray::mid((ByteArray *)&local_78,this_00,
                       (ulong)((Elf32_Shdr *)local_a0.data_)->sh_offset,
                       (ulong)((Elf32_Shdr *)local_a0.data_)->sh_size);
        ByteArray::operator=((ByteArray *)((long)local_a0.data_ + 0x48),(ByteArray *)&local_78);
        ByteArray::~ByteArray((ByteArray *)&local_78);
        uVar11 = ((Elf32_Shdr *)local_a0.data_)->sh_type;
      }
      ppEVar13 = &this->symTab;
      if ((uVar11 == 2) ||
         ((uVar11 == 3 &&
          ((ppEVar13 = &this->strTab, this->strTab == (ElfSection *)0x0 ||
           (uVar16 != (this->fileHeader).e_shstrndx)))))) {
        *ppEVar13 = (ElfSection *)local_a0.data_;
      }
      iVar4._M_current =
           (this->segmentlessSections).
           super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->segmentlessSections).
          super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ElfSection*,std::allocator<ElfSection*>>::_M_realloc_insert<ElfSection*const&>
                  (local_88,iVar4,(ElfSection **)&local_a0);
      }
      else {
        *iVar4._M_current = (ElfSection *)local_a0.data_;
        pppEVar2 = &(this->segmentlessSections).
                    super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
LAB_00176acb:
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->fileHeader).e_shnum);
  }
  determinePartOrder(this);
  loadSectionNames(this);
  if (sort) {
    __first._M_current =
         (this->segmentlessSections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->segmentlessSections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar17 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar14 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ElfSection**,std::vector<ElfSection*,std::allocator<ElfSection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ElfSection*,ElfSection*)>>
                (__first,__last,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(ElfSection_*,_ElfSection_*)>)0x175874);
      ppEVar13 = __first._M_current + 1;
      _Var12._M_current = __first._M_current;
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        for (; ppEVar13 != __last._M_current; ppEVar13 = ppEVar13 + 1) {
          pEVar9 = *ppEVar13;
          uVar16 = (pEVar9->header).sh_offset;
          if (uVar16 < ((*__first._M_current)->header).sh_offset) {
            memmove((void *)((long)_Var12._M_current +
                            (0x10 - ((long)ppEVar13 - (long)__first._M_current))),__first._M_current
                    ,(long)ppEVar13 - (long)__first._M_current);
            _Var12._M_current = __first._M_current;
          }
          else {
            pEVar5 = *_Var12._M_current;
            uVar11 = (pEVar5->header).sh_offset;
            _Var12._M_current = ppEVar13;
            while (uVar16 < uVar11) {
              *_Var12._M_current = pEVar5;
              pEVar5 = _Var12._M_current[-2];
              _Var12._M_current = _Var12._M_current + -1;
              uVar11 = (pEVar5->header).sh_offset;
            }
          }
          *_Var12._M_current = pEVar9;
          _Var12._M_current = ppEVar13;
        }
      }
      else {
        __n = 8;
        ppEVar15 = ppEVar13;
        do {
          ppEVar3 = __first._M_current + __n;
          pEVar9 = *(ElfSection **)((long)__first._M_current + __n);
          uVar16 = (pEVar9->header).sh_offset;
          if (uVar16 < ((*__first._M_current)->header).sh_offset) {
            memmove(ppEVar13,__first._M_current,__n);
            _Var12._M_current = __first._M_current;
          }
          else {
            pEVar5 = *_Var12._M_current;
            uVar11 = (pEVar5->header).sh_offset;
            _Var12._M_current = ppEVar3;
            ppEVar6 = ppEVar15;
            while (uVar16 < uVar11) {
              *ppEVar6 = pEVar5;
              pEVar5 = ppEVar6[-2];
              _Var12._M_current = ppEVar6 + -1;
              ppEVar6 = _Var12._M_current;
              uVar11 = (pEVar5->header).sh_offset;
            }
          }
          *_Var12._M_current = pEVar9;
          __n = __n + 8;
          ppEVar15 = ppEVar15 + 1;
          _Var12._M_current = ppEVar3;
        } while (__n != 0x80);
        for (ppEVar13 = __first._M_current + 0x10; ppEVar13 != __last._M_current;
            ppEVar13 = ppEVar13 + 1) {
          pEVar9 = ppEVar13[-1];
          pEVar5 = *ppEVar13;
          uVar11 = (pEVar5->header).sh_offset;
          uVar16 = (pEVar9->header).sh_offset;
          ppEVar15 = ppEVar13;
          while (uVar11 < uVar16) {
            *ppEVar15 = pEVar9;
            pEVar9 = ppEVar15[-2];
            ppEVar15 = ppEVar15 + -1;
            uVar16 = (pEVar9->header).sh_offset;
          }
          *ppEVar15 = pEVar5;
        }
      }
    }
    ppEVar10 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->segments).
                                super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10) >> 3)) {
      lVar14 = 0;
      do {
        ElfSegment::sortSections(ppEVar10[lVar14]);
        lVar14 = lVar14 + 1;
        ppEVar10 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (lVar14 < (int)((ulong)((long)(this->segments).
                                            super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppEVar10) >> 3));
    }
  }
  return true;
}

Assistant:

bool ElfFile::load(ByteArray& data, bool sort)
{
	fileData = data;

	loadElfHeader();
	symTab = nullptr;
	strTab = nullptr;

	// load segments
	for (size_t i = 0; i < fileHeader.e_phnum; i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		
		Elf32_Phdr sectionHeader;
		loadProgramHeader(sectionHeader, fileData, pos);

		ByteArray segmentData = fileData.mid(sectionHeader.p_offset,sectionHeader.p_filesz);
		ElfSegment* segment = new ElfSegment(sectionHeader,segmentData);
		segments.push_back(segment);
	}
	
	// load sections and assign them to segments
	for (int i = 0; i < fileHeader.e_shnum; i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;

		Elf32_Shdr sectionHeader;
		loadSectionHeader(sectionHeader, fileData, pos);

		ElfSection* section = new ElfSection(sectionHeader);
		sections.push_back(section);

		// check if the section belongs to a segment
		ElfSegment* owner = nullptr;
		for (int k = 0; k < (int)segments.size(); k++)
		{
			if (segments[k]->isSectionPartOf(section))
			{
				owner = segments[k];
				break;
			}
		}

		if (owner != nullptr)
		{
			owner->addSection(section);
		} else {
			if (section->getType() != SHT_NOBITS && section->getType() != SHT_NULL)
			{
				ByteArray data = fileData.mid(section->getOffset(),section->getSize());
				section->setData(data);
			}

			switch (section->getType())
			{
			case SHT_SYMTAB:
				symTab = section;
				break;
			case SHT_STRTAB:
				if (!strTab || i != fileHeader.e_shstrndx)
				{
					strTab = section;
				}
				break;
			}

			segmentlessSections.push_back(section);
		}
	}
	
	determinePartOrder();
	loadSectionNames();

	if (sort)
	{
		std::sort(segmentlessSections.begin(),segmentlessSections.end(),compareSection);

		for (int i = 0; i < (int)segments.size(); i++)
		{
			segments[i]->sortSections();
		}
	}

	return true;
}